

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void __thiscall pstore::file::deleter_base::~deleter_base(deleter_base *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  this->_vptr_deleter_base = (_func_int **)&PTR__deleter_base_00135960;
  if (this->released_ == false) {
    if ((this->unlinker_).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar3);
    }
    (*(this->unlinker_)._M_invoker)((_Any_data *)&this->unlinker_,&this->path_);
    this->released_ = true;
  }
  p_Var1 = (this->unlinker_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->unlinker_,(_Any_data *)&this->unlinker_,__destroy_functor);
  }
  pcVar2 = (this->path_)._M_dataplus._M_p;
  paVar4 = &(this->path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

deleter_base::~deleter_base () noexcept {
            no_ex_escape ([this] () { this->unlink (); });
        }